

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O2

void __thiscall pstore::broker::gc_watch_thread::stop(gc_watch_thread *this,int signum)

{
  double __x;
  not_null<const_char_*> local_30;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mut_);
  this->done_ = true;
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  local_30.ptr_ = "asking gc process watch thread to exit";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_30);
  log((pstore *)0x6,__x);
  LOCK();
  (this->cv_).signal_.super___atomic_base<int>._M_i = signum;
  UNLOCK();
  descriptor_condition_variable::notify_all_no_except(&(this->cv_).cv_);
  return;
}

Assistant:

void gc_watch_thread::stop (int const signum) {
            {
                std::unique_lock<decltype (mut_)> const lock{mut_};
                done_ = true;
            }
            log (priority::info, "asking gc process watch thread to exit");
            cv_.notify_all (signum);
        }